

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

xmlParserErrors xmlIOErr(int err)

{
  switch(err) {
  case 1:
    return XML_IO_EPERM;
  case 2:
    return XML_IO_ENOENT;
  case 3:
    return XML_IO_ESRCH;
  case 4:
    return XML_IO_EINTR;
  case 5:
    return XML_IO_EIO;
  case 6:
    return XML_IO_ENXIO;
  case 7:
  case 0xf:
  case 0x1a:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x59:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x60:
  case 99:
  case 100:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x70:
  case 0x71:
    goto switchD_001566ee_caseD_7;
  case 8:
    return XML_IO_ENOEXEC;
  case 9:
    return XML_IO_EBADF;
  case 10:
    return XML_IO_ECHILD;
  case 0xb:
    return XML_IO_EAGAIN;
  case 0xc:
    return XML_IO_ENOMEM;
  case 0xd:
    return XML_IO_EACCES;
  case 0xe:
    return XML_IO_EFAULT;
  case 0x10:
    return XML_IO_EBUSY;
  case 0x11:
    return XML_IO_EEXIST;
  case 0x12:
    return XML_IO_EXDEV;
  case 0x13:
    return XML_IO_ENODEV;
  case 0x14:
    return XML_IO_ENOTDIR;
  case 0x15:
    return XML_IO_EISDIR;
  case 0x16:
    return XML_IO_EINVAL;
  case 0x17:
    return XML_IO_ENFILE;
  case 0x18:
    return XML_IO_EMFILE;
  case 0x19:
    return XML_IO_ENOTTY;
  case 0x1b:
    return XML_IO_EFBIG;
  case 0x1c:
    return XML_IO_ENOSPC;
  case 0x1d:
    return XML_IO_ESPIPE;
  case 0x1e:
    return XML_IO_EROFS;
  case 0x1f:
    return XML_IO_EMLINK;
  case 0x20:
    return XML_IO_EPIPE;
  case 0x21:
    return XML_IO_EDOM;
  case 0x22:
    return XML_IO_ERANGE;
  case 0x23:
    return XML_IO_EDEADLK;
  case 0x24:
    return XML_IO_ENAMETOOLONG;
  case 0x25:
    return XML_IO_ENOLCK;
  case 0x26:
    return XML_IO_ENOSYS;
  case 0x27:
    return XML_IO_ENOTEMPTY;
  case 0x4a:
    return XML_IO_EBADMSG;
  case 0x58:
    return XML_IO_ENOTSOCK;
  case 0x5a:
    return XML_IO_EMSGSIZE;
  case 0x5f:
    return XML_IO_ENOTSUP;
  case 0x61:
    return XML_IO_EAFNOSUPPORT;
  case 0x62:
    return XML_IO_EADDRINUSE;
  case 0x65:
    return XML_IO_ENETUNREACH;
  case 0x6a:
    return XML_IO_EISCONN;
  case 0x6e:
    return XML_IO_ETIMEDOUT;
  case 0x6f:
    return XML_IO_ECONNREFUSED;
  case 0x72:
    return XML_IO_EALREADY;
  case 0x73:
    return XML_IO_EINPROGRESS;
  default:
    if (err == 0x7d) {
      return XML_IO_ECANCELED;
    }
switchD_001566ee_caseD_7:
    return XML_IO_UNKNOWN;
  }
}

Assistant:

static xmlParserErrors
xmlIOErr(int err)
{
    xmlParserErrors code;

    switch (err) {
#ifdef EACCES
        case EACCES: code = XML_IO_EACCES; break;
#endif
#ifdef EAGAIN
        case EAGAIN: code = XML_IO_EAGAIN; break;
#endif
#ifdef EBADF
        case EBADF: code = XML_IO_EBADF; break;
#endif
#ifdef EBADMSG
        case EBADMSG: code = XML_IO_EBADMSG; break;
#endif
#ifdef EBUSY
        case EBUSY: code = XML_IO_EBUSY; break;
#endif
#ifdef ECANCELED
        case ECANCELED: code = XML_IO_ECANCELED; break;
#endif
#ifdef ECHILD
        case ECHILD: code = XML_IO_ECHILD; break;
#endif
#ifdef EDEADLK
        case EDEADLK: code = XML_IO_EDEADLK; break;
#endif
#ifdef EDOM
        case EDOM: code = XML_IO_EDOM; break;
#endif
#ifdef EEXIST
        case EEXIST: code = XML_IO_EEXIST; break;
#endif
#ifdef EFAULT
        case EFAULT: code = XML_IO_EFAULT; break;
#endif
#ifdef EFBIG
        case EFBIG: code = XML_IO_EFBIG; break;
#endif
#ifdef EINPROGRESS
        case EINPROGRESS: code = XML_IO_EINPROGRESS; break;
#endif
#ifdef EINTR
        case EINTR: code = XML_IO_EINTR; break;
#endif
#ifdef EINVAL
        case EINVAL: code = XML_IO_EINVAL; break;
#endif
#ifdef EIO
        case EIO: code = XML_IO_EIO; break;
#endif
#ifdef EISDIR
        case EISDIR: code = XML_IO_EISDIR; break;
#endif
#ifdef EMFILE
        case EMFILE: code = XML_IO_EMFILE; break;
#endif
#ifdef EMLINK
        case EMLINK: code = XML_IO_EMLINK; break;
#endif
#ifdef EMSGSIZE
        case EMSGSIZE: code = XML_IO_EMSGSIZE; break;
#endif
#ifdef ENAMETOOLONG
        case ENAMETOOLONG: code = XML_IO_ENAMETOOLONG; break;
#endif
#ifdef ENFILE
        case ENFILE: code = XML_IO_ENFILE; break;
#endif
#ifdef ENODEV
        case ENODEV: code = XML_IO_ENODEV; break;
#endif
#ifdef ENOENT
        case ENOENT: code = XML_IO_ENOENT; break;
#endif
#ifdef ENOEXEC
        case ENOEXEC: code = XML_IO_ENOEXEC; break;
#endif
#ifdef ENOLCK
        case ENOLCK: code = XML_IO_ENOLCK; break;
#endif
#ifdef ENOMEM
        case ENOMEM: code = XML_IO_ENOMEM; break;
#endif
#ifdef ENOSPC
        case ENOSPC: code = XML_IO_ENOSPC; break;
#endif
#ifdef ENOSYS
        case ENOSYS: code = XML_IO_ENOSYS; break;
#endif
#ifdef ENOTDIR
        case ENOTDIR: code = XML_IO_ENOTDIR; break;
#endif
#ifdef ENOTEMPTY
        case ENOTEMPTY: code = XML_IO_ENOTEMPTY; break;
#endif
#ifdef ENOTSUP
        case ENOTSUP: code = XML_IO_ENOTSUP; break;
#endif
#ifdef ENOTTY
        case ENOTTY: code = XML_IO_ENOTTY; break;
#endif
#ifdef ENXIO
        case ENXIO: code = XML_IO_ENXIO; break;
#endif
#ifdef EPERM
        case EPERM: code = XML_IO_EPERM; break;
#endif
#ifdef EPIPE
        case EPIPE: code = XML_IO_EPIPE; break;
#endif
#ifdef ERANGE
        case ERANGE: code = XML_IO_ERANGE; break;
#endif
#ifdef EROFS
        case EROFS: code = XML_IO_EROFS; break;
#endif
#ifdef ESPIPE
        case ESPIPE: code = XML_IO_ESPIPE; break;
#endif
#ifdef ESRCH
        case ESRCH: code = XML_IO_ESRCH; break;
#endif
#ifdef ETIMEDOUT
        case ETIMEDOUT: code = XML_IO_ETIMEDOUT; break;
#endif
#ifdef EXDEV
        case EXDEV: code = XML_IO_EXDEV; break;
#endif
#ifdef ENOTSOCK
        case ENOTSOCK: code = XML_IO_ENOTSOCK; break;
#endif
#ifdef EISCONN
        case EISCONN: code = XML_IO_EISCONN; break;
#endif
#ifdef ECONNREFUSED
        case ECONNREFUSED: code = XML_IO_ECONNREFUSED; break;
#endif
#ifdef ENETUNREACH
        case ENETUNREACH: code = XML_IO_ENETUNREACH; break;
#endif
#ifdef EADDRINUSE
        case EADDRINUSE: code = XML_IO_EADDRINUSE; break;
#endif
#ifdef EALREADY
        case EALREADY: code = XML_IO_EALREADY; break;
#endif
#ifdef EAFNOSUPPORT
        case EAFNOSUPPORT: code = XML_IO_EAFNOSUPPORT; break;
#endif
        default: code = XML_IO_UNKNOWN; break;
    }

    return(code);
}